

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::NewWithSizeClass(PageHeap *this,Length n,uint32_t sizeclass)

{
  Span *span;
  undefined1 local_38 [8];
  LockingContext context;
  
  context.heap = (PageHeap *)0x0;
  local_38 = (undefined1  [8])this;
  SpinLock::Lock(&this->lock_);
  span = NewLocked(this,n,(LockingContext *)local_38);
  if ((span != (Span *)0x0) &&
     ((this->pagemap_cache_).array_[span->start & 0xffff] = span->start & 0xffffffffffff0000 | 0x80,
     sizeclass != 0)) {
    RegisterSizeClass(this,span,sizeclass);
  }
  LockingContext::~LockingContext((LockingContext *)local_38);
  return span;
}

Assistant:

Span* PageHeap::NewWithSizeClass(Length n, uint32_t sizeclass) {
  LockingContext context{this, &lock_};

  Span* span = NewLocked(n, &context);
  if (!span) {
    return span;
  }
  InvalidateCachedSizeClass(span->start);
  if (sizeclass) {
    RegisterSizeClass(span, sizeclass);
  }
  return span;
}